

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O2

void __thiscall
TEST_CommandLineTestRunner_defaultTestsAreRunInOrderTheyAreInRepository_Test::
~TEST_CommandLineTestRunner_defaultTestsAreRunInOrderTheyAreInRepository_Test
          (TEST_CommandLineTestRunner_defaultTestsAreRunInOrderTheyAreInRepository_Test *this)

{
  TEST_GROUP_CppUTestGroupCommandLineTestRunner::~TEST_GROUP_CppUTestGroupCommandLineTestRunner
            (&this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST(CommandLineTestRunner, defaultTestsAreRunInOrderTheyAreInRepository)
{
    const char* argv[] = { "tests.exe", "-v"};

    registry.addTest(test2);
    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    SimpleStringCollection stringCollection;
    commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().split("\n", stringCollection);
    STRCMP_CONTAINS("test2", stringCollection[0].asCharString());
    STRCMP_CONTAINS("test1", stringCollection[1].asCharString());
}